

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

bool __thiscall calculator::ExpressionParser<__int128>::isHex(ExpressionParser<__int128> *this)

{
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  __int128 *p_Var7;
  long extraout_RDX;
  char c;
  ulong in_RDI;
  char h;
  char x;
  undefined1 local_39;
  undefined1 local_1;
  
  lVar3 = *(long *)(in_RDI + 0x20);
  uVar5 = std::__cxx11::string::size();
  if (lVar3 + 2U < uVar5) {
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar6;
    c = (char)*(undefined8 *)(in_RDI + 0x20) + '\x02';
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar2 = *pcVar6;
    iVar4 = tolower((int)cVar1);
    local_39 = false;
    if (iVar4 == 0x78) {
      p_Var7 = toInteger((__int128 *)(ulong)(uint)(int)cVar2,c);
      local_39 = extraout_RDX < (long)(ulong)(p_Var7 < (__int128 *)0x10);
    }
    local_1 = local_39;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isHex() const
  {
    if (index_ + 2 < expr_.size())
    {
      char x = expr_[index_ + 1];
      char h = expr_[index_ + 2];
      return (std::tolower(x) == 'x' && toInteger(h) <= 0xf);
    }
    return false;
  }